

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O2

int register_log_suite(zt_unit *unit)

{
  zt_unit_suite *suite;
  
  suite = zt_unit_register_suite_
                    (unit,"logging tests",(zt_unit_setup_fn)0x0,(zt_unit_teardown_fn)0x0,(void *)0x0
                     ,zt_unit_try_c);
  zt_unit_register_test(suite,"basic",basic_tests);
  zt_unit_register_test(suite,"threaded",threaded_tests);
  return 0;
}

Assistant:

int
register_log_suite(struct zt_unit *unit)
{
    struct zt_unit_suite * suite;

    suite = zt_unit_register_suite(unit, "logging tests", NULL, NULL, NULL);
    zt_unit_register_test(suite, "basic", basic_tests);
#ifdef HAVE_PTHREADS
    zt_unit_register_test(suite, "threaded", threaded_tests);
#endif /* HAVE_PTHREADS */

    return 0;
}